

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test.c
# Opt level: O2

int test_cloned_monster(flatcc_builder_t *B)

{
  flatcc_refmap_t *pfVar1;
  int iVar2;
  flatbuffers_buffer_ref_t fVar3;
  void *addr;
  char *pcVar4;
  MyGame_Example_Monster_table_t t;
  void *addr_00;
  size_t size;
  flatcc_refmap_t refmap;
  
  refmap.count = 0;
  refmap.buckets = 0;
  refmap.table = (flatcc_refmap_item *)0x0;
  gen_monster(B,0);
  addr = flatcc_builder_finalize_aligned_buffer(B,&size);
  hexdump("monster table",addr,size,_stderr);
  iVar2 = MyGame_Example_Monster_verify_as_root(addr,size);
  if (iVar2 == 0) {
    iVar2 = verify_monster(addr);
    if (iVar2 == 0) {
      flatcc_builder_reset(B);
      pfVar1 = B->refmap;
      B->refmap = &refmap;
      t = MyGame_Example_Monster_as_root(addr);
      fVar3 = MyGame_Example_Monster_clone_as_root(B,t);
      if (fVar3 == 0) {
        pcVar4 = "Cloned Monster didn\'t actually clone.";
      }
      else {
        B->refmap = pfVar1;
        addr_00 = flatcc_builder_finalize_aligned_buffer(B,&size);
        hexdump("cloned monster table",addr_00,size,_stderr);
        iVar2 = MyGame_Example_Monster_verify_as_root(addr_00,size);
        if (iVar2 != 0) {
          pcVar4 = flatcc_verify_error_string(iVar2);
          printf("Cloned Monster buffer failed to verify, got: %s\n",pcVar4);
          return -1;
        }
        iVar2 = verify_monster(addr_00);
        if (iVar2 == 0) {
          flatcc_refmap_clear(&refmap);
          flatcc_builder_aligned_free(addr);
          flatcc_builder_aligned_free(addr_00);
          return 0;
        }
        pcVar4 = "Cloned Monster did not have the expected content.";
      }
      printf(pcVar4);
    }
  }
  else {
    pcVar4 = flatcc_verify_error_string(iVar2);
    printf("Monster buffer failed to verify, got: %s\n",pcVar4);
  }
  return -1;
}

Assistant:

int test_cloned_monster(flatcc_builder_t *B)
{
    void *buffer;
    void *cloned_buffer;
    size_t size;
    int ret;
    flatcc_refmap_t refmap, *refmap_old;

    flatcc_refmap_init(&refmap);
    gen_monster(B, 0);

    buffer = flatcc_builder_finalize_aligned_buffer(B, &size);
    hexdump("monster table", buffer, size, stderr);
    if ((ret = ns(Monster_verify_as_root(buffer, size)))) {
        printf("Monster buffer failed to verify, got: %s\n", flatcc_verify_error_string(ret));
        return -1;
    }
    if (verify_monster(buffer)) {
        return -1;
    }
    flatcc_builder_reset(B);

    /*
     * Clone works without setting a refmap - but then shared references
     * get expanded - and then the verify monster check fails on a DAG
     * test.
     */
    refmap_old = flatcc_builder_set_refmap(B, &refmap);
    if (!ns(Monster_clone_as_root(B, ns(Monster_as_root(buffer))))) {
        printf("Cloned Monster didn't actually clone.");
        return -1;
    };
    /*
     * Restoring old refmap (or zeroing) is optional if we cleared the
     * buffer in this scope, but we don't so we must detach and clean up
     * the refmap manually. refmap_old is likely just null, but this
     * way we do not interfere with caller.
     */
    flatcc_builder_set_refmap(B, refmap_old);
    cloned_buffer = flatcc_builder_finalize_aligned_buffer(B, &size);
    hexdump("cloned monster table", cloned_buffer, size, stderr);
    if ((ret = ns(Monster_verify_as_root(cloned_buffer, size)))) {
        printf("Cloned Monster buffer failed to verify, got: %s\n", flatcc_verify_error_string(ret));
        return -1;
    }
    if (verify_monster(cloned_buffer)) {
        printf("Cloned Monster did not have the expected content.");
        return -1;
    }

    flatcc_refmap_clear(&refmap);
    flatcc_builder_aligned_free(buffer);
    flatcc_builder_aligned_free(cloned_buffer);
    return ret;
}